

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::~ConsoleReporter(ConsoleReporter *this)

{
  ThreadedSectionInfo *pTVar1;
  GroupInfo *pGVar2;
  pointer pcVar3;
  TestRunInfo *pTVar4;
  IConfig *pIVar5;
  
  (this->super_StreamingReporterBase).super_SharedImpl<Catch::IStreamingReporter>.
  super_IStreamingReporter.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__ConsoleReporter_00161448;
  std::
  vector<Catch::Ptr<Catch::ThreadedSectionInfo>,_std::allocator<Catch::Ptr<Catch::ThreadedSectionInfo>_>_>
  ::~vector(&(this->super_StreamingReporterBase).m_rootSections);
  pTVar1 = (this->super_StreamingReporterBase).currentSectionInfo.m_p;
  if (pTVar1 != (ThreadedSectionInfo *)0x0) {
    (*(pTVar1->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
      [3])();
  }
  Option<Catch::TestCaseInfo>::reset(&(this->super_StreamingReporterBase).unusedTestCaseInfo);
  pGVar2 = (this->super_StreamingReporterBase).unusedGroupInfo.nullableValue;
  if ((pGVar2 != (GroupInfo *)0x0) &&
     (pcVar3 = (pGVar2->name)._M_dataplus._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar3 != &(pGVar2->name).field_2)) {
    operator_delete(pcVar3);
  }
  (this->super_StreamingReporterBase).unusedGroupInfo.nullableValue = (GroupInfo *)0x0;
  pTVar4 = (this->super_StreamingReporterBase).testRunInfo.nullableValue;
  if ((pTVar4 != (TestRunInfo *)0x0) &&
     (pcVar3 = (pTVar4->name)._M_dataplus._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar3 != &(pTVar4->name).field_2)) {
    operator_delete(pcVar3);
  }
  (this->super_StreamingReporterBase).testRunInfo.nullableValue = (TestRunInfo *)0x0;
  pIVar5 = (this->super_StreamingReporterBase).m_config.m_p;
  if (pIVar5 != (IConfig *)0x0) {
    (*(pIVar5->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  IReporter::~IReporter((IReporter *)this);
  return;
}

Assistant:

StreamingReporterBase::~StreamingReporterBase() {}